

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  ulong uVar64;
  long lVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  ulong *puVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  bool bVar74;
  bool bVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  float fVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [64];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar158 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar166 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1820 [16];
  long local_1810;
  long local_1808;
  undefined1 (*local_1800) [16];
  ulong local_17f8;
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined4 local_15d0;
  undefined4 uStack_15cc;
  undefined4 uStack_15c8;
  undefined4 uStack_15c4;
  undefined1 local_15c0 [16];
  undefined4 local_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  undefined4 local_15a0;
  undefined4 uStack_159c;
  undefined4 uStack_1598;
  undefined4 uStack_1594;
  undefined1 local_1590 [16];
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined1 local_1570 [16];
  uint local_1560;
  uint uStack_155c;
  uint uStack_1558;
  uint uStack_1554;
  uint uStack_1550;
  uint uStack_154c;
  uint uStack_1548;
  uint uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar70 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar112 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar114 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar119 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar122 = fVar115 * 0.99999964;
  fVar123 = fVar120 * 0.99999964;
  fVar124 = fVar121 * 0.99999964;
  fVar115 = fVar115 * 1.0000004;
  fVar120 = fVar120 * 1.0000004;
  fVar121 = fVar121 * 1.0000004;
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_17f8 = uVar71 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar94 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  iVar2 = (tray->tfar).field_0.i[k];
  auVar99 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_1420._16_16_ = mm_lookupmask_ps._240_16_;
  local_1420._0_16_ = mm_lookupmask_ps._0_16_;
  local_1800 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  bVar75 = true;
  auVar76._8_4_ = 0xbf800000;
  auVar76._0_8_ = 0xbf800000bf800000;
  auVar76._12_4_ = 0xbf800000;
  auVar76._16_4_ = 0xbf800000;
  auVar76._20_4_ = 0xbf800000;
  auVar76._24_4_ = 0xbf800000;
  auVar76._28_4_ = 0xbf800000;
  auVar76 = vblendvps_avx(auVar86,auVar76,local_1420);
  auVar110 = ZEXT3264(auVar76);
  fVar125 = fVar122;
  fVar128 = fVar122;
  fVar129 = fVar122;
  fVar130 = fVar122;
  fVar131 = fVar122;
  fVar132 = fVar122;
  fVar133 = fVar122;
  fVar136 = fVar123;
  fVar137 = fVar123;
  fVar138 = fVar123;
  fVar139 = fVar123;
  fVar140 = fVar123;
  fVar141 = fVar123;
  fVar142 = fVar123;
  fVar143 = fVar124;
  fVar144 = fVar124;
  fVar145 = fVar124;
  fVar146 = fVar124;
  fVar147 = fVar124;
  fVar148 = fVar124;
  fVar149 = fVar124;
  fVar151 = fVar115;
  fVar152 = fVar115;
  fVar153 = fVar115;
  fVar154 = fVar115;
  fVar155 = fVar115;
  fVar156 = fVar115;
  fVar157 = fVar115;
  fVar159 = fVar120;
  fVar160 = fVar120;
  fVar161 = fVar120;
  fVar162 = fVar120;
  fVar163 = fVar120;
  fVar164 = fVar120;
  fVar165 = fVar120;
  fVar167 = fVar121;
  fVar168 = fVar121;
  fVar169 = fVar121;
  fVar170 = fVar121;
  fVar171 = fVar121;
  fVar172 = fVar121;
  fVar173 = fVar121;
  do {
    uVar72 = puVar70[-1];
    puVar70 = puVar70 + -1;
    local_1660 = auVar94._0_32_;
    local_1680 = auVar99._0_32_;
    local_16c0 = auVar112._0_32_;
    local_16e0 = auVar114._0_32_;
    local_1700 = auVar119._0_32_;
    while ((uVar72 & 8) == 0) {
      auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar71),local_16c0);
      auVar84._4_4_ = fVar125 * auVar76._4_4_;
      auVar84._0_4_ = fVar122 * auVar76._0_4_;
      auVar84._8_4_ = fVar128 * auVar76._8_4_;
      auVar84._12_4_ = fVar129 * auVar76._12_4_;
      auVar84._16_4_ = fVar130 * auVar76._16_4_;
      auVar84._20_4_ = fVar131 * auVar76._20_4_;
      auVar84._24_4_ = fVar132 * auVar76._24_4_;
      auVar84._28_4_ = auVar76._28_4_;
      auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar73),local_16e0);
      auVar43._4_4_ = fVar136 * auVar76._4_4_;
      auVar43._0_4_ = fVar123 * auVar76._0_4_;
      auVar43._8_4_ = fVar137 * auVar76._8_4_;
      auVar43._12_4_ = fVar138 * auVar76._12_4_;
      auVar43._16_4_ = fVar139 * auVar76._16_4_;
      auVar43._20_4_ = fVar140 * auVar76._20_4_;
      auVar43._24_4_ = fVar141 * auVar76._24_4_;
      auVar43._28_4_ = auVar76._28_4_;
      auVar76 = vmaxps_avx(auVar84,auVar43);
      auVar86 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + uVar69),local_1700);
      auVar32._4_4_ = fVar143 * auVar86._4_4_;
      auVar32._0_4_ = fVar124 * auVar86._0_4_;
      auVar32._8_4_ = fVar144 * auVar86._8_4_;
      auVar32._12_4_ = fVar145 * auVar86._12_4_;
      auVar32._16_4_ = fVar146 * auVar86._16_4_;
      auVar32._20_4_ = fVar147 * auVar86._20_4_;
      auVar32._24_4_ = fVar148 * auVar86._24_4_;
      auVar32._28_4_ = auVar86._28_4_;
      auVar86 = vmaxps_avx(auVar32,local_1660);
      auVar76 = vmaxps_avx(auVar76,auVar86);
      auVar86 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + local_17f8),local_16c0);
      auVar33._4_4_ = fVar151 * auVar86._4_4_;
      auVar33._0_4_ = fVar115 * auVar86._0_4_;
      auVar33._8_4_ = fVar152 * auVar86._8_4_;
      auVar33._12_4_ = fVar153 * auVar86._12_4_;
      auVar33._16_4_ = fVar154 * auVar86._16_4_;
      auVar33._20_4_ = fVar155 * auVar86._20_4_;
      auVar33._24_4_ = fVar156 * auVar86._24_4_;
      auVar33._28_4_ = auVar86._28_4_;
      auVar86 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar73 ^ 0x20)),local_16e0);
      auVar34._4_4_ = fVar159 * auVar86._4_4_;
      auVar34._0_4_ = fVar120 * auVar86._0_4_;
      auVar34._8_4_ = fVar160 * auVar86._8_4_;
      auVar34._12_4_ = fVar161 * auVar86._12_4_;
      auVar34._16_4_ = fVar162 * auVar86._16_4_;
      auVar34._20_4_ = fVar163 * auVar86._20_4_;
      auVar34._24_4_ = fVar164 * auVar86._24_4_;
      auVar34._28_4_ = auVar86._28_4_;
      auVar86 = vminps_avx(auVar33,auVar34);
      auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar72 + 0x40 + (uVar69 ^ 0x20)),local_1700);
      auVar35._4_4_ = fVar167 * auVar84._4_4_;
      auVar35._0_4_ = fVar121 * auVar84._0_4_;
      auVar35._8_4_ = fVar168 * auVar84._8_4_;
      auVar35._12_4_ = fVar169 * auVar84._12_4_;
      auVar35._16_4_ = fVar170 * auVar84._16_4_;
      auVar35._20_4_ = fVar171 * auVar84._20_4_;
      auVar35._24_4_ = fVar172 * auVar84._24_4_;
      auVar35._28_4_ = auVar84._28_4_;
      auVar84 = vminps_avx(auVar35,local_1680);
      auVar86 = vminps_avx(auVar86,auVar84);
      auVar76 = vcmpps_avx(auVar76,auVar86,2);
      uVar66 = vmovmskps_avx(auVar76);
      if (uVar66 == 0) goto LAB_005e9eec;
      uVar64 = uVar72 & 0xfffffffffffffff0;
      lVar68 = 0;
      for (uVar72 = (ulong)(byte)uVar66; (uVar72 & 1) == 0;
          uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar68 = lVar68 + 1;
      }
      uVar72 = *(ulong *)(uVar64 + lVar68 * 8);
      uVar66 = (uVar66 & 0xff) - 1 & uVar66 & 0xff;
      uVar67 = (ulong)uVar66;
      if (uVar66 != 0) {
        *puVar70 = uVar72;
        lVar68 = 0;
        for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          lVar68 = lVar68 + 1;
        }
        uVar66 = uVar66 - 1 & uVar66;
        uVar67 = (ulong)uVar66;
        bVar74 = uVar66 == 0;
        while( true ) {
          puVar70 = puVar70 + 1;
          uVar72 = *(ulong *)(uVar64 + lVar68 * 8);
          if (bVar74) break;
          *puVar70 = uVar72;
          lVar68 = 0;
          for (uVar72 = uVar67; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
            lVar68 = lVar68 + 1;
          }
          uVar67 = uVar67 - 1 & uVar67;
          bVar74 = uVar67 == 0;
        }
      }
    }
    local_1810 = (ulong)((uint)uVar72 & 0xf) - 8;
    if (local_1810 != 0) {
      uVar72 = uVar72 & 0xfffffffffffffff0;
      local_1808 = 0;
      local_16a0 = auVar110._0_32_;
      local_17c0 = fVar121;
      fStack_17bc = fVar167;
      fStack_17b8 = fVar168;
      fStack_17b4 = fVar169;
      fStack_17b0 = fVar170;
      fStack_17ac = fVar171;
      fStack_17a8 = fVar172;
      fStack_17a4 = fVar173;
      local_17a0 = fVar120;
      fStack_179c = fVar159;
      fStack_1798 = fVar160;
      fStack_1794 = fVar161;
      fStack_1790 = fVar162;
      fStack_178c = fVar163;
      fStack_1788 = fVar164;
      fStack_1784 = fVar165;
      local_1780 = fVar115;
      fStack_177c = fVar151;
      fStack_1778 = fVar152;
      fStack_1774 = fVar153;
      fStack_1770 = fVar154;
      fStack_176c = fVar155;
      fStack_1768 = fVar156;
      fStack_1764 = fVar157;
      local_1760 = fVar124;
      fStack_175c = fVar143;
      fStack_1758 = fVar144;
      fStack_1754 = fVar145;
      fStack_1750 = fVar146;
      fStack_174c = fVar147;
      fStack_1748 = fVar148;
      fStack_1744 = fVar149;
      local_1740 = fVar123;
      fStack_173c = fVar136;
      fStack_1738 = fVar137;
      fStack_1734 = fVar138;
      fStack_1730 = fVar139;
      fStack_172c = fVar140;
      fStack_1728 = fVar141;
      fStack_1724 = fVar142;
      local_1720 = fVar122;
      fStack_171c = fVar125;
      fStack_1718 = fVar128;
      fStack_1714 = fVar129;
      fStack_1710 = fVar130;
      fStack_170c = fVar131;
      fStack_1708 = fVar132;
      fStack_1704 = fVar133;
      do {
        lVar65 = local_1808 * 0x60;
        pSVar3 = context->scene;
        ppfVar4 = (pSVar3->vertices).items;
        pfVar5 = ppfVar4[*(uint *)(uVar72 + 0x40 + lVar65)];
        auVar87._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x20 + lVar65));
        auVar87._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + lVar65));
        pfVar6 = ppfVar4[*(uint *)(uVar72 + 0x48 + lVar65)];
        auVar89._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x28 + lVar65));
        auVar89._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 8 + lVar65));
        pfVar7 = ppfVar4[*(uint *)(uVar72 + 0x44 + lVar65)];
        auVar101._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x24 + lVar65));
        auVar101._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 4 + lVar65));
        pfVar8 = ppfVar4[*(uint *)(uVar72 + 0x4c + lVar65)];
        auVar116._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x2c + lVar65));
        auVar116._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0xc + lVar65));
        lVar68 = uVar72 + 0x40 + lVar65;
        local_13e0 = *(undefined8 *)(lVar68 + 0x10);
        uStack_13d8 = *(undefined8 *)(lVar68 + 0x18);
        uStack_13d0 = local_13e0;
        uStack_13c8 = uStack_13d8;
        lVar68 = uVar72 + 0x50 + lVar65;
        local_1400 = *(undefined8 *)(lVar68 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar68 + 0x18);
        auVar85 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x10 + lVar65)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x18 + lVar65)));
        auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x10 + lVar65)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x18 + lVar65)));
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x14 + lVar65)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x1c + lVar65)));
        auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x14 + lVar65)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x1c + lVar65)));
        auVar39 = vunpcklps_avx(auVar37,auVar79);
        auVar40 = vunpcklps_avx(auVar85,auVar38);
        auVar37 = vunpckhps_avx(auVar85,auVar38);
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x30 + lVar65)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x38 + lVar65)));
        auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar72 + 0x30 + lVar65)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar72 + 0x38 + lVar65)));
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x34 + lVar65)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x3c + lVar65)));
        auVar85 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar72 + 0x34 + lVar65)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar72 + 0x3c + lVar65)));
        auVar85 = vunpcklps_avx(auVar79,auVar85);
        auVar42 = vunpcklps_avx(auVar38,auVar41);
        auVar79 = vunpckhps_avx(auVar38,auVar41);
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        auVar76 = vunpcklps_avx(auVar101,auVar116);
        auVar86 = vunpcklps_avx(auVar87,auVar89);
        auVar43 = vunpcklps_avx(auVar86,auVar76);
        auVar76 = vunpckhps_avx(auVar86,auVar76);
        auVar86 = vunpckhps_avx(auVar101,auVar116);
        auVar84 = vunpckhps_avx(auVar87,auVar89);
        auVar86 = vunpcklps_avx(auVar84,auVar86);
        auVar90._16_16_ = auVar40;
        auVar90._0_16_ = auVar40;
        auVar102._16_16_ = auVar37;
        auVar102._0_16_ = auVar37;
        auVar80._16_16_ = auVar39;
        auVar80._0_16_ = auVar39;
        auVar166._16_16_ = auVar42;
        auVar166._0_16_ = auVar42;
        auVar95._16_16_ = auVar79;
        auVar95._0_16_ = auVar79;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar117._4_4_ = uVar1;
        auVar117._0_4_ = uVar1;
        auVar117._8_4_ = uVar1;
        auVar117._12_4_ = uVar1;
        auVar117._16_4_ = uVar1;
        auVar117._20_4_ = uVar1;
        auVar117._24_4_ = uVar1;
        auVar117._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar134._4_4_ = uVar1;
        auVar134._0_4_ = uVar1;
        auVar134._8_4_ = uVar1;
        auVar134._12_4_ = uVar1;
        auVar134._16_4_ = uVar1;
        auVar134._20_4_ = uVar1;
        auVar134._24_4_ = uVar1;
        auVar134._28_4_ = uVar1;
        auVar77._16_16_ = auVar85;
        auVar77._0_16_ = auVar85;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar150._4_4_ = uVar1;
        auVar150._0_4_ = uVar1;
        auVar150._8_4_ = uVar1;
        auVar150._12_4_ = uVar1;
        auVar150._16_4_ = uVar1;
        auVar150._20_4_ = uVar1;
        auVar150._24_4_ = uVar1;
        auVar150._28_4_ = uVar1;
        local_1620 = vsubps_avx(auVar43,auVar117);
        auVar43 = vsubps_avx(auVar76,auVar134);
        local_1640 = vsubps_avx(auVar86,auVar150);
        auVar76 = vsubps_avx(auVar90,auVar117);
        auVar86 = vsubps_avx(auVar102,auVar134);
        auVar84 = vsubps_avx(auVar80,auVar150);
        auVar32 = vsubps_avx(auVar166,auVar117);
        auVar33 = vsubps_avx(auVar95,auVar134);
        auVar34 = vsubps_avx(auVar77,auVar150);
        local_1440 = vsubps_avx(auVar32,local_1620);
        local_1480 = vsubps_avx(auVar33,auVar43);
        local_1460 = vsubps_avx(auVar34,local_1640);
        auVar78._0_4_ = local_1620._0_4_ + auVar32._0_4_;
        auVar78._4_4_ = local_1620._4_4_ + auVar32._4_4_;
        auVar78._8_4_ = local_1620._8_4_ + auVar32._8_4_;
        auVar78._12_4_ = local_1620._12_4_ + auVar32._12_4_;
        auVar78._16_4_ = local_1620._16_4_ + auVar32._16_4_;
        auVar78._20_4_ = local_1620._20_4_ + auVar32._20_4_;
        auVar78._24_4_ = local_1620._24_4_ + auVar32._24_4_;
        auVar78._28_4_ = local_1620._28_4_ + auVar32._28_4_;
        auVar88._0_4_ = auVar43._0_4_ + auVar33._0_4_;
        auVar88._4_4_ = auVar43._4_4_ + auVar33._4_4_;
        auVar88._8_4_ = auVar43._8_4_ + auVar33._8_4_;
        auVar88._12_4_ = auVar43._12_4_ + auVar33._12_4_;
        auVar88._16_4_ = auVar43._16_4_ + auVar33._16_4_;
        auVar88._20_4_ = auVar43._20_4_ + auVar33._20_4_;
        auVar88._24_4_ = auVar43._24_4_ + auVar33._24_4_;
        auVar88._28_4_ = auVar43._28_4_ + auVar33._28_4_;
        fVar11 = local_1640._0_4_;
        auVar96._0_4_ = auVar34._0_4_ + fVar11;
        fVar12 = local_1640._4_4_;
        auVar96._4_4_ = auVar34._4_4_ + fVar12;
        fVar13 = local_1640._8_4_;
        auVar96._8_4_ = auVar34._8_4_ + fVar13;
        fVar14 = local_1640._12_4_;
        auVar96._12_4_ = auVar34._12_4_ + fVar14;
        fVar15 = local_1640._16_4_;
        auVar96._16_4_ = auVar34._16_4_ + fVar15;
        fVar16 = local_1640._20_4_;
        auVar96._20_4_ = auVar34._20_4_ + fVar16;
        fVar17 = local_1640._24_4_;
        auVar96._24_4_ = auVar34._24_4_ + fVar17;
        fVar115 = local_1640._28_4_;
        auVar96._28_4_ = auVar34._28_4_ + fVar115;
        auVar36._4_4_ = local_1460._4_4_ * auVar88._4_4_;
        auVar36._0_4_ = local_1460._0_4_ * auVar88._0_4_;
        auVar36._8_4_ = local_1460._8_4_ * auVar88._8_4_;
        auVar36._12_4_ = local_1460._12_4_ * auVar88._12_4_;
        auVar36._16_4_ = local_1460._16_4_ * auVar88._16_4_;
        auVar36._20_4_ = local_1460._20_4_ * auVar88._20_4_;
        auVar36._24_4_ = local_1460._24_4_ * auVar88._24_4_;
        auVar36._28_4_ = uVar1;
        auVar79 = vfmsub231ps_fma(auVar36,local_1480,auVar96);
        auVar45._4_4_ = local_1440._4_4_ * auVar96._4_4_;
        auVar45._0_4_ = local_1440._0_4_ * auVar96._0_4_;
        auVar45._8_4_ = local_1440._8_4_ * auVar96._8_4_;
        auVar45._12_4_ = local_1440._12_4_ * auVar96._12_4_;
        auVar45._16_4_ = local_1440._16_4_ * auVar96._16_4_;
        auVar45._20_4_ = local_1440._20_4_ * auVar96._20_4_;
        auVar45._24_4_ = local_1440._24_4_ * auVar96._24_4_;
        auVar45._28_4_ = auVar96._28_4_;
        auVar37 = vfmsub231ps_fma(auVar45,local_1460,auVar78);
        auVar46._4_4_ = local_1480._4_4_ * auVar78._4_4_;
        auVar46._0_4_ = local_1480._0_4_ * auVar78._0_4_;
        auVar46._8_4_ = local_1480._8_4_ * auVar78._8_4_;
        auVar46._12_4_ = local_1480._12_4_ * auVar78._12_4_;
        auVar46._16_4_ = local_1480._16_4_ * auVar78._16_4_;
        auVar46._20_4_ = local_1480._20_4_ * auVar78._20_4_;
        auVar46._24_4_ = local_1480._24_4_ * auVar78._24_4_;
        auVar46._28_4_ = auVar78._28_4_;
        auVar85 = vfmsub231ps_fma(auVar46,local_1440,auVar88);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar135._4_4_ = uVar1;
        auVar135._0_4_ = uVar1;
        auVar135._8_4_ = uVar1;
        auVar135._12_4_ = uVar1;
        auVar135._16_4_ = uVar1;
        auVar135._20_4_ = uVar1;
        auVar135._24_4_ = uVar1;
        auVar135._28_4_ = uVar1;
        local_14c0 = *(float *)(ray + k * 4 + 0x60);
        auVar47._4_4_ = local_14c0 * auVar85._4_4_;
        auVar47._0_4_ = local_14c0 * auVar85._0_4_;
        auVar47._8_4_ = local_14c0 * auVar85._8_4_;
        auVar47._12_4_ = local_14c0 * auVar85._12_4_;
        auVar47._16_4_ = local_14c0 * 0.0;
        auVar47._20_4_ = local_14c0 * 0.0;
        auVar47._24_4_ = local_14c0 * 0.0;
        auVar47._28_4_ = auVar88._28_4_;
        auVar37 = vfmadd231ps_fma(auVar47,auVar135,ZEXT1632(auVar37));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_14a0._4_4_ = uVar1;
        local_14a0._0_4_ = uVar1;
        local_14a0._8_4_ = uVar1;
        local_14a0._12_4_ = uVar1;
        local_14a0._16_4_ = uVar1;
        local_14a0._20_4_ = uVar1;
        local_14a0._24_4_ = uVar1;
        local_14a0._28_4_ = uVar1;
        auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),local_14a0,ZEXT1632(auVar79));
        local_14e0 = vsubps_avx(auVar43,auVar86);
        local_1500 = vsubps_avx(local_1640,auVar84);
        auVar158._0_4_ = auVar43._0_4_ + auVar86._0_4_;
        auVar158._4_4_ = auVar43._4_4_ + auVar86._4_4_;
        auVar158._8_4_ = auVar43._8_4_ + auVar86._8_4_;
        auVar158._12_4_ = auVar43._12_4_ + auVar86._12_4_;
        auVar158._16_4_ = auVar43._16_4_ + auVar86._16_4_;
        auVar158._20_4_ = auVar43._20_4_ + auVar86._20_4_;
        auVar158._24_4_ = auVar43._24_4_ + auVar86._24_4_;
        auVar158._28_4_ = auVar43._28_4_ + auVar86._28_4_;
        auVar97._0_4_ = fVar11 + auVar84._0_4_;
        auVar97._4_4_ = fVar12 + auVar84._4_4_;
        auVar97._8_4_ = fVar13 + auVar84._8_4_;
        auVar97._12_4_ = fVar14 + auVar84._12_4_;
        auVar97._16_4_ = fVar15 + auVar84._16_4_;
        auVar97._20_4_ = fVar16 + auVar84._20_4_;
        auVar97._24_4_ = fVar17 + auVar84._24_4_;
        fVar120 = auVar84._28_4_;
        auVar97._28_4_ = fVar115 + fVar120;
        fVar100 = local_1500._0_4_;
        fVar106 = local_1500._4_4_;
        auVar48._4_4_ = auVar158._4_4_ * fVar106;
        auVar48._0_4_ = auVar158._0_4_ * fVar100;
        fVar109 = local_1500._8_4_;
        auVar48._8_4_ = auVar158._8_4_ * fVar109;
        fVar20 = local_1500._12_4_;
        auVar48._12_4_ = auVar158._12_4_ * fVar20;
        fVar23 = local_1500._16_4_;
        auVar48._16_4_ = auVar158._16_4_ * fVar23;
        fVar26 = local_1500._20_4_;
        auVar48._20_4_ = auVar158._20_4_ * fVar26;
        fVar29 = local_1500._24_4_;
        auVar48._24_4_ = auVar158._24_4_ * fVar29;
        auVar48._28_4_ = fVar115;
        auVar85 = vfmsub231ps_fma(auVar48,local_14e0,auVar97);
        auVar35 = vsubps_avx(local_1620,auVar76);
        fVar104 = auVar35._0_4_;
        fVar107 = auVar35._4_4_;
        auVar49._4_4_ = auVar97._4_4_ * fVar107;
        auVar49._0_4_ = auVar97._0_4_ * fVar104;
        fVar18 = auVar35._8_4_;
        auVar49._8_4_ = auVar97._8_4_ * fVar18;
        fVar21 = auVar35._12_4_;
        auVar49._12_4_ = auVar97._12_4_ * fVar21;
        fVar24 = auVar35._16_4_;
        auVar49._16_4_ = auVar97._16_4_ * fVar24;
        fVar27 = auVar35._20_4_;
        auVar49._20_4_ = auVar97._20_4_ * fVar27;
        fVar30 = auVar35._24_4_;
        auVar49._24_4_ = auVar97._24_4_ * fVar30;
        auVar49._28_4_ = auVar97._28_4_;
        auVar126._0_4_ = local_1620._0_4_ + auVar76._0_4_;
        auVar126._4_4_ = local_1620._4_4_ + auVar76._4_4_;
        auVar126._8_4_ = local_1620._8_4_ + auVar76._8_4_;
        auVar126._12_4_ = local_1620._12_4_ + auVar76._12_4_;
        auVar126._16_4_ = local_1620._16_4_ + auVar76._16_4_;
        auVar126._20_4_ = local_1620._20_4_ + auVar76._20_4_;
        auVar126._24_4_ = local_1620._24_4_ + auVar76._24_4_;
        auVar126._28_4_ = local_1620._28_4_ + auVar76._28_4_;
        auVar79 = vfmsub231ps_fma(auVar49,local_1500,auVar126);
        fVar105 = local_14e0._0_4_;
        fVar108 = local_14e0._4_4_;
        auVar50._4_4_ = auVar126._4_4_ * fVar108;
        auVar50._0_4_ = auVar126._0_4_ * fVar105;
        fVar19 = local_14e0._8_4_;
        auVar50._8_4_ = auVar126._8_4_ * fVar19;
        fVar22 = local_14e0._12_4_;
        auVar50._12_4_ = auVar126._12_4_ * fVar22;
        fVar25 = local_14e0._16_4_;
        auVar50._16_4_ = auVar126._16_4_ * fVar25;
        fVar28 = local_14e0._20_4_;
        auVar50._20_4_ = auVar126._20_4_ * fVar28;
        fVar31 = local_14e0._24_4_;
        auVar50._24_4_ = auVar126._24_4_ * fVar31;
        auVar50._28_4_ = local_1500._28_4_;
        auVar38 = vfmsub231ps_fma(auVar50,auVar35,auVar158);
        auVar118._0_4_ = auVar38._0_4_ * local_14c0;
        auVar118._4_4_ = auVar38._4_4_ * local_14c0;
        auVar118._8_4_ = auVar38._8_4_ * local_14c0;
        auVar118._12_4_ = auVar38._12_4_ * local_14c0;
        auVar118._16_4_ = local_14c0 * 0.0;
        auVar118._20_4_ = local_14c0 * 0.0;
        auVar118._24_4_ = local_14c0 * 0.0;
        auVar118._28_4_ = 0;
        auVar79 = vfmadd231ps_fma(auVar118,auVar135,ZEXT1632(auVar79));
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_14a0,ZEXT1632(auVar85));
        auVar36 = vsubps_avx(auVar76,auVar32);
        auVar91._0_4_ = auVar76._0_4_ + auVar32._0_4_;
        auVar91._4_4_ = auVar76._4_4_ + auVar32._4_4_;
        auVar91._8_4_ = auVar76._8_4_ + auVar32._8_4_;
        auVar91._12_4_ = auVar76._12_4_ + auVar32._12_4_;
        auVar91._16_4_ = auVar76._16_4_ + auVar32._16_4_;
        auVar91._20_4_ = auVar76._20_4_ + auVar32._20_4_;
        auVar91._24_4_ = auVar76._24_4_ + auVar32._24_4_;
        auVar91._28_4_ = auVar76._28_4_ + auVar32._28_4_;
        auVar32 = vsubps_avx(auVar86,auVar33);
        auVar103._0_4_ = auVar86._0_4_ + auVar33._0_4_;
        auVar103._4_4_ = auVar86._4_4_ + auVar33._4_4_;
        auVar103._8_4_ = auVar86._8_4_ + auVar33._8_4_;
        auVar103._12_4_ = auVar86._12_4_ + auVar33._12_4_;
        auVar103._16_4_ = auVar86._16_4_ + auVar33._16_4_;
        auVar103._20_4_ = auVar86._20_4_ + auVar33._20_4_;
        auVar103._24_4_ = auVar86._24_4_ + auVar33._24_4_;
        auVar103._28_4_ = auVar86._28_4_ + auVar33._28_4_;
        auVar33 = vsubps_avx(auVar84,auVar34);
        auVar81._0_4_ = auVar84._0_4_ + auVar34._0_4_;
        auVar81._4_4_ = auVar84._4_4_ + auVar34._4_4_;
        auVar81._8_4_ = auVar84._8_4_ + auVar34._8_4_;
        auVar81._12_4_ = auVar84._12_4_ + auVar34._12_4_;
        auVar81._16_4_ = auVar84._16_4_ + auVar34._16_4_;
        auVar81._20_4_ = auVar84._20_4_ + auVar34._20_4_;
        auVar81._24_4_ = auVar84._24_4_ + auVar34._24_4_;
        auVar81._28_4_ = fVar120 + auVar34._28_4_;
        auVar51._4_4_ = auVar33._4_4_ * auVar103._4_4_;
        auVar51._0_4_ = auVar33._0_4_ * auVar103._0_4_;
        auVar51._8_4_ = auVar33._8_4_ * auVar103._8_4_;
        auVar51._12_4_ = auVar33._12_4_ * auVar103._12_4_;
        auVar51._16_4_ = auVar33._16_4_ * auVar103._16_4_;
        auVar51._20_4_ = auVar33._20_4_ * auVar103._20_4_;
        auVar51._24_4_ = auVar33._24_4_ * auVar103._24_4_;
        auVar51._28_4_ = fVar120;
        auVar38 = vfmsub231ps_fma(auVar51,auVar32,auVar81);
        auVar52._4_4_ = auVar81._4_4_ * auVar36._4_4_;
        auVar52._0_4_ = auVar81._0_4_ * auVar36._0_4_;
        auVar52._8_4_ = auVar81._8_4_ * auVar36._8_4_;
        auVar52._12_4_ = auVar81._12_4_ * auVar36._12_4_;
        auVar52._16_4_ = auVar81._16_4_ * auVar36._16_4_;
        auVar52._20_4_ = auVar81._20_4_ * auVar36._20_4_;
        auVar52._24_4_ = auVar81._24_4_ * auVar36._24_4_;
        auVar52._28_4_ = auVar81._28_4_;
        auVar85 = vfmsub231ps_fma(auVar52,auVar33,auVar91);
        auVar53._4_4_ = auVar32._4_4_ * auVar91._4_4_;
        auVar53._0_4_ = auVar32._0_4_ * auVar91._0_4_;
        auVar53._8_4_ = auVar32._8_4_ * auVar91._8_4_;
        auVar53._12_4_ = auVar32._12_4_ * auVar91._12_4_;
        auVar53._16_4_ = auVar32._16_4_ * auVar91._16_4_;
        auVar53._20_4_ = auVar32._20_4_ * auVar91._20_4_;
        auVar53._24_4_ = auVar32._24_4_ * auVar91._24_4_;
        auVar53._28_4_ = auVar91._28_4_;
        auVar39 = vfmsub231ps_fma(auVar53,auVar36,auVar103);
        auVar92._0_4_ = local_14c0 * auVar39._0_4_;
        auVar92._4_4_ = local_14c0 * auVar39._4_4_;
        auVar92._8_4_ = local_14c0 * auVar39._8_4_;
        auVar92._12_4_ = local_14c0 * auVar39._12_4_;
        auVar92._16_4_ = local_14c0 * 0.0;
        auVar92._20_4_ = local_14c0 * 0.0;
        auVar92._24_4_ = local_14c0 * 0.0;
        auVar92._28_4_ = 0;
        auVar85 = vfmadd231ps_fma(auVar92,auVar135,ZEXT1632(auVar85));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_14a0,ZEXT1632(auVar38));
        local_13a0 = ZEXT1632(auVar79);
        local_13c0 = auVar37._0_4_;
        fStack_13bc = auVar37._4_4_;
        fStack_13b8 = auVar37._8_4_;
        fStack_13b4 = auVar37._12_4_;
        local_1380 = ZEXT1632(CONCAT412(auVar85._12_4_ + auVar79._12_4_ + fStack_13b4,
                                        CONCAT48(auVar85._8_4_ + auVar79._8_4_ + fStack_13b8,
                                                 CONCAT44(auVar85._4_4_ +
                                                          auVar79._4_4_ + fStack_13bc,
                                                          auVar85._0_4_ + auVar79._0_4_ + local_13c0
                                                         ))));
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar82._16_4_ = 0x7fffffff;
        auVar82._20_4_ = 0x7fffffff;
        auVar82._24_4_ = 0x7fffffff;
        auVar82._28_4_ = 0x7fffffff;
        auVar76 = vminps_avx(ZEXT1632(auVar37),local_13a0);
        auVar76 = vminps_avx(auVar76,ZEXT1632(auVar85));
        local_1540 = vandps_avx(local_1380,auVar82);
        fVar115 = local_1540._0_4_ * 1.1920929e-07;
        fVar120 = local_1540._4_4_ * 1.1920929e-07;
        auVar54._4_4_ = fVar120;
        auVar54._0_4_ = fVar115;
        fVar121 = local_1540._8_4_ * 1.1920929e-07;
        auVar54._8_4_ = fVar121;
        fVar122 = local_1540._12_4_ * 1.1920929e-07;
        auVar54._12_4_ = fVar122;
        fVar123 = local_1540._16_4_ * 1.1920929e-07;
        auVar54._16_4_ = fVar123;
        fVar124 = local_1540._20_4_ * 1.1920929e-07;
        auVar54._20_4_ = fVar124;
        fVar125 = local_1540._24_4_ * 1.1920929e-07;
        auVar54._24_4_ = fVar125;
        auVar54._28_4_ = 0x34000000;
        auVar111._0_8_ = CONCAT44(fVar120,fVar115) ^ 0x8000000080000000;
        auVar111._8_4_ = -fVar121;
        auVar111._12_4_ = -fVar122;
        auVar111._16_4_ = -fVar123;
        auVar111._20_4_ = -fVar124;
        auVar111._24_4_ = -fVar125;
        auVar111._28_4_ = 0xb4000000;
        auVar76 = vcmpps_avx(auVar76,auVar111,5);
        local_1520 = ZEXT1632(auVar37);
        auVar84 = vmaxps_avx(local_1520,local_13a0);
        auVar86 = vmaxps_avx(auVar84,ZEXT1632(auVar85));
        auVar86 = vcmpps_avx(auVar86,auVar54,2);
        auVar86 = vorps_avx(auVar76,auVar86);
        fVar125 = fStack_171c;
        fVar128 = fStack_1718;
        fVar129 = fStack_1714;
        fVar130 = fStack_1710;
        fVar131 = fStack_170c;
        fVar132 = fStack_1708;
        fVar133 = fStack_1704;
        fVar122 = local_1720;
        fVar136 = fStack_173c;
        fVar137 = fStack_1738;
        fVar138 = fStack_1734;
        fVar139 = fStack_1730;
        fVar140 = fStack_172c;
        fVar141 = fStack_1728;
        fVar142 = fStack_1724;
        fVar123 = local_1740;
        fVar143 = fStack_175c;
        fVar144 = fStack_1758;
        fVar145 = fStack_1754;
        fVar146 = fStack_1750;
        fVar147 = fStack_174c;
        fVar148 = fStack_1748;
        fVar149 = fStack_1744;
        fVar124 = local_1760;
        fVar151 = fStack_177c;
        fVar152 = fStack_1778;
        fVar153 = fStack_1774;
        fVar154 = fStack_1770;
        fVar155 = fStack_176c;
        fVar156 = fStack_1768;
        fVar157 = fStack_1764;
        fVar115 = local_1780;
        fVar159 = fStack_179c;
        fVar160 = fStack_1798;
        fVar161 = fStack_1794;
        fVar162 = fStack_1790;
        fVar163 = fStack_178c;
        fVar164 = fStack_1788;
        fVar165 = fStack_1784;
        fVar120 = local_17a0;
        fVar167 = fStack_17bc;
        fVar168 = fStack_17b8;
        fVar169 = fStack_17b4;
        fVar170 = fStack_17b0;
        fVar171 = fStack_17ac;
        fVar172 = fStack_17a8;
        fVar173 = fStack_17a4;
        fVar121 = local_17c0;
        if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar86 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar86 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar86 >> 0x7f,0) == '\0') &&
              (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar86 >> 0xbf,0) == '\0') &&
            (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar86[0x1f]) {
LAB_005e9e6a:
          auVar112 = ZEXT3264(local_16c0);
          auVar114 = ZEXT3264(local_16e0);
          auVar119 = ZEXT3264(local_1700);
          auVar94 = ZEXT3264(local_1660);
          auVar99 = ZEXT3264(local_1680);
          auVar110 = ZEXT3264(local_16a0);
        }
        else {
          auVar55._4_4_ = fVar108 * local_1460._4_4_;
          auVar55._0_4_ = fVar105 * local_1460._0_4_;
          auVar55._8_4_ = fVar19 * local_1460._8_4_;
          auVar55._12_4_ = fVar22 * local_1460._12_4_;
          auVar55._16_4_ = fVar25 * local_1460._16_4_;
          auVar55._20_4_ = fVar28 * local_1460._20_4_;
          auVar55._24_4_ = fVar31 * local_1460._24_4_;
          auVar55._28_4_ = auVar76._28_4_;
          auVar56._4_4_ = local_1480._4_4_ * fVar107;
          auVar56._0_4_ = local_1480._0_4_ * fVar104;
          auVar56._8_4_ = local_1480._8_4_ * fVar18;
          auVar56._12_4_ = local_1480._12_4_ * fVar21;
          auVar56._16_4_ = local_1480._16_4_ * fVar24;
          auVar56._20_4_ = local_1480._20_4_ * fVar27;
          auVar56._24_4_ = local_1480._24_4_ * fVar30;
          auVar56._28_4_ = 0x34000000;
          auVar37 = vfmsub213ps_fma(local_1480,local_1500,auVar55);
          auVar57._4_4_ = auVar32._4_4_ * fVar106;
          auVar57._0_4_ = auVar32._0_4_ * fVar100;
          auVar57._8_4_ = auVar32._8_4_ * fVar109;
          auVar57._12_4_ = auVar32._12_4_ * fVar20;
          auVar57._16_4_ = auVar32._16_4_ * fVar23;
          auVar57._20_4_ = auVar32._20_4_ * fVar26;
          auVar57._24_4_ = auVar32._24_4_ * fVar29;
          auVar57._28_4_ = auVar84._28_4_;
          auVar58._4_4_ = auVar33._4_4_ * fVar107;
          auVar58._0_4_ = auVar33._0_4_ * fVar104;
          auVar58._8_4_ = auVar33._8_4_ * fVar18;
          auVar58._12_4_ = auVar33._12_4_ * fVar21;
          auVar58._16_4_ = auVar33._16_4_ * fVar24;
          auVar58._20_4_ = auVar33._20_4_ * fVar27;
          auVar58._24_4_ = auVar33._24_4_ * fVar30;
          auVar58._28_4_ = local_1540._28_4_;
          auVar85 = vfmsub213ps_fma(auVar33,local_14e0,auVar57);
          auVar76 = vandps_avx(auVar55,auVar82);
          auVar84 = vandps_avx(auVar57,auVar82);
          auVar76 = vcmpps_avx(auVar76,auVar84,1);
          local_1360 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar37),auVar76);
          auVar59._4_4_ = fVar108 * auVar36._4_4_;
          auVar59._0_4_ = fVar105 * auVar36._0_4_;
          auVar59._8_4_ = fVar19 * auVar36._8_4_;
          auVar59._12_4_ = fVar22 * auVar36._12_4_;
          auVar59._16_4_ = fVar25 * auVar36._16_4_;
          auVar59._20_4_ = fVar28 * auVar36._20_4_;
          auVar59._24_4_ = fVar31 * auVar36._24_4_;
          auVar59._28_4_ = auVar76._28_4_;
          auVar37 = vfmsub213ps_fma(auVar36,local_1500,auVar58);
          auVar60._4_4_ = local_1440._4_4_ * fVar106;
          auVar60._0_4_ = local_1440._0_4_ * fVar100;
          auVar60._8_4_ = local_1440._8_4_ * fVar109;
          auVar60._12_4_ = local_1440._12_4_ * fVar20;
          auVar60._16_4_ = local_1440._16_4_ * fVar23;
          auVar60._20_4_ = local_1440._20_4_ * fVar26;
          auVar60._24_4_ = local_1440._24_4_ * fVar29;
          auVar60._28_4_ = auVar84._28_4_;
          auVar85 = vfmsub213ps_fma(local_1460,auVar35,auVar60);
          auVar76 = vandps_avx(auVar60,auVar82);
          auVar84 = vandps_avx(auVar58,auVar82);
          auVar76 = vcmpps_avx(auVar76,auVar84,1);
          local_1340 = vblendvps_avx(ZEXT1632(auVar37),ZEXT1632(auVar85),auVar76);
          auVar37 = vfmsub213ps_fma(local_1440,local_14e0,auVar56);
          auVar85 = vfmsub213ps_fma(auVar32,auVar35,auVar59);
          auVar76 = vandps_avx(auVar56,auVar82);
          auVar84 = vandps_avx(auVar59,auVar82);
          auVar76 = vcmpps_avx(auVar76,auVar84,1);
          local_1320 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar37),auVar76);
          auVar37 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
          fVar100 = local_1320._0_4_;
          auVar83._0_4_ = fVar100 * local_14c0;
          fVar104 = local_1320._4_4_;
          auVar83._4_4_ = fVar104 * local_14c0;
          fVar105 = local_1320._8_4_;
          auVar83._8_4_ = fVar105 * local_14c0;
          fVar106 = local_1320._12_4_;
          auVar83._12_4_ = fVar106 * local_14c0;
          fVar107 = local_1320._16_4_;
          auVar83._16_4_ = fVar107 * local_14c0;
          fVar108 = local_1320._20_4_;
          auVar83._20_4_ = fVar108 * local_14c0;
          fVar109 = local_1320._24_4_;
          auVar83._24_4_ = fVar109 * local_14c0;
          auVar83._28_4_ = 0;
          auVar85 = vfmadd213ps_fma(auVar135,local_1340,auVar83);
          auVar85 = vfmadd213ps_fma(local_14a0,local_1360,ZEXT1632(auVar85));
          auVar84 = ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                       CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                CONCAT44(auVar85._4_4_ + auVar85._4_4_,
                                                         auVar85._0_4_ + auVar85._0_4_))));
          auVar61._4_4_ = fVar104 * fVar12;
          auVar61._0_4_ = fVar100 * fVar11;
          auVar61._8_4_ = fVar105 * fVar13;
          auVar61._12_4_ = fVar106 * fVar14;
          auVar61._16_4_ = fVar107 * fVar15;
          auVar61._20_4_ = fVar108 * fVar16;
          auVar61._24_4_ = fVar109 * fVar17;
          auVar61._28_4_ = auVar86._28_4_;
          auVar85 = vfmadd213ps_fma(auVar43,local_1340,auVar61);
          auVar38 = vfmadd213ps_fma(local_1620,local_1360,ZEXT1632(auVar85));
          auVar76 = vrcpps_avx(auVar84);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar127._16_4_ = 0x3f800000;
          auVar127._20_4_ = 0x3f800000;
          auVar127._24_4_ = 0x3f800000;
          auVar127._28_4_ = 0x3f800000;
          auVar85 = vfnmadd213ps_fma(auVar76,auVar84,auVar127);
          auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar76,auVar76);
          local_12a0 = ZEXT1632(CONCAT412(auVar85._12_4_ * (auVar38._12_4_ + auVar38._12_4_),
                                          CONCAT48(auVar85._8_4_ * (auVar38._8_4_ + auVar38._8_4_),
                                                   CONCAT44(auVar85._4_4_ *
                                                            (auVar38._4_4_ + auVar38._4_4_),
                                                            auVar85._0_4_ *
                                                            (auVar38._0_4_ + auVar38._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar113._4_4_ = uVar1;
          auVar113._0_4_ = uVar1;
          auVar113._8_4_ = uVar1;
          auVar113._12_4_ = uVar1;
          auVar113._16_4_ = uVar1;
          auVar113._20_4_ = uVar1;
          auVar113._24_4_ = uVar1;
          auVar113._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_1600._4_4_ = uVar1;
          local_1600._0_4_ = uVar1;
          local_1600._8_4_ = uVar1;
          local_1600._12_4_ = uVar1;
          local_1600._16_4_ = uVar1;
          local_1600._20_4_ = uVar1;
          local_1600._24_4_ = uVar1;
          local_1600._28_4_ = uVar1;
          auVar76 = vcmpps_avx(auVar113,local_12a0,2);
          auVar86 = vcmpps_avx(local_12a0,local_1600,2);
          auVar76 = vandps_avx(auVar76,auVar86);
          auVar85 = vpackssdw_avx(auVar76._0_16_,auVar76._16_16_);
          auVar37 = vpand_avx(auVar85,auVar37);
          auVar76 = vpmovsxwd_avx2(auVar37);
          if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar76 >> 0x7f,0) == '\0') &&
                (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0xbf,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar76[0x1f]) goto LAB_005e9e6a;
          auVar76 = vcmpps_avx(auVar84,_DAT_01faff00,4);
          auVar85 = vpackssdw_avx(auVar76._0_16_,auVar76._16_16_);
          auVar37 = vpand_avx(auVar37,auVar85);
          local_1300 = vpmovsxwd_avx2(auVar37);
          if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0x7f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0xbf,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_1300[0x1f]) goto LAB_005e9e6a;
          uStack_13b0 = 0;
          uStack_13ac = 0;
          uStack_13a8 = 0;
          uStack_13a4 = 0;
          local_1220 = local_1420;
          auVar76 = vrcpps_avx(local_1380);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar98._16_4_ = 0x3f800000;
          auVar98._20_4_ = 0x3f800000;
          auVar98._24_4_ = 0x3f800000;
          auVar98._28_4_ = 0x3f800000;
          auVar85 = vfnmadd213ps_fma(local_1380,auVar76,auVar98);
          auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar76,auVar76);
          auVar93._8_4_ = 0x219392ef;
          auVar93._0_8_ = 0x219392ef219392ef;
          auVar93._12_4_ = 0x219392ef;
          auVar93._16_4_ = 0x219392ef;
          auVar93._20_4_ = 0x219392ef;
          auVar93._24_4_ = 0x219392ef;
          auVar93._28_4_ = 0x219392ef;
          auVar76 = vcmpps_avx(local_1540,auVar93,5);
          auVar76 = vandps_avx(auVar76,ZEXT1632(auVar85));
          auVar62._4_4_ = fStack_13bc * auVar76._4_4_;
          auVar62._0_4_ = local_13c0 * auVar76._0_4_;
          auVar62._8_4_ = fStack_13b8 * auVar76._8_4_;
          auVar62._12_4_ = fStack_13b4 * auVar76._12_4_;
          auVar62._16_4_ = auVar76._16_4_ * 0.0;
          auVar62._20_4_ = auVar76._20_4_ * 0.0;
          auVar62._24_4_ = auVar76._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar86 = vminps_avx(auVar62,auVar98);
          auVar63._4_4_ = auVar79._4_4_ * auVar76._4_4_;
          auVar63._0_4_ = auVar79._0_4_ * auVar76._0_4_;
          auVar63._8_4_ = auVar79._8_4_ * auVar76._8_4_;
          auVar63._12_4_ = auVar79._12_4_ * auVar76._12_4_;
          auVar63._16_4_ = auVar76._16_4_ * 0.0;
          auVar63._20_4_ = auVar76._20_4_ * 0.0;
          auVar63._24_4_ = auVar76._24_4_ * 0.0;
          auVar63._28_4_ = auVar35._28_4_;
          auVar76 = vminps_avx(auVar63,auVar98);
          auVar84 = vsubps_avx(auVar98,auVar86);
          auVar43 = vsubps_avx(auVar98,auVar76);
          local_12c0 = vblendvps_avx(auVar76,auVar84,local_1420);
          local_12e0 = vblendvps_avx(auVar86,auVar43,local_1420);
          auVar110 = ZEXT3264(local_16a0);
          fVar11 = local_16a0._0_4_;
          fVar12 = local_16a0._4_4_;
          fVar13 = local_16a0._8_4_;
          fVar14 = local_16a0._12_4_;
          fVar15 = local_16a0._16_4_;
          fVar16 = local_16a0._20_4_;
          fVar17 = local_16a0._24_4_;
          local_1260._4_4_ = fVar12 * local_1340._4_4_;
          local_1260._0_4_ = fVar11 * local_1340._0_4_;
          local_1260._8_4_ = fVar13 * local_1340._8_4_;
          local_1260._12_4_ = fVar14 * local_1340._12_4_;
          local_1260._16_4_ = fVar15 * local_1340._16_4_;
          local_1260._20_4_ = fVar16 * local_1340._20_4_;
          local_1260._24_4_ = fVar17 * local_1340._24_4_;
          local_1260._28_4_ = local_12c0._28_4_;
          local_1280[0] = local_1360._0_4_ * fVar11;
          local_1280[1] = local_1360._4_4_ * fVar12;
          local_1280[2] = local_1360._8_4_ * fVar13;
          local_1280[3] = local_1360._12_4_ * fVar14;
          fStack_1270 = local_1360._16_4_ * fVar15;
          fStack_126c = local_1360._20_4_ * fVar16;
          fStack_1268 = local_1360._24_4_ * fVar17;
          uStack_1264 = local_12e0._28_4_;
          local_1240[0] = fVar11 * fVar100;
          local_1240[1] = fVar12 * fVar104;
          local_1240[2] = fVar13 * fVar105;
          local_1240[3] = fVar14 * fVar106;
          fStack_1230 = fVar15 * fVar107;
          fStack_122c = fVar16 * fVar108;
          fStack_1228 = fVar17 * fVar109;
          uStack_1224 = auVar84._28_4_;
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          uVar64 = (ulong)(byte)(SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar37 >> 0x3f,0) << 7);
          auVar112 = ZEXT3264(local_16c0);
          auVar114 = ZEXT3264(local_16e0);
          auVar119 = ZEXT3264(local_1700);
          auVar94 = ZEXT3264(local_1660);
          auVar99 = ZEXT3264(local_1680);
          fStack_14bc = local_14c0;
          fStack_14b8 = local_14c0;
          fStack_14b4 = local_14c0;
          fStack_14b0 = local_14c0;
          fStack_14ac = local_14c0;
          fStack_14a8 = local_14c0;
          fStack_14a4 = local_14c0;
          do {
            uVar67 = 0;
            for (uVar44 = uVar64; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              uVar67 = uVar67 + 1;
            }
            uVar66 = *(uint *)((long)&local_13e0 + uVar67 * 4);
            pGVar9 = (pSVar3->geometries).items[uVar66].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar64 = uVar64 ^ 1L << (uVar67 & 0x3f);
            }
            else {
              local_1620._0_8_ = uVar67;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005e9f02:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar75;
              }
              local_1640._0_8_ = uVar64;
              uVar64 = (ulong)(uint)((int)uVar67 * 4);
              local_15a0 = *(undefined4 *)(local_12e0 + uVar64);
              uVar1 = *(undefined4 *)(local_12c0 + uVar64);
              local_1590._4_4_ = uVar1;
              local_1590._0_4_ = uVar1;
              local_1590._8_4_ = uVar1;
              local_1590._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar64);
              local_17f0.context = context->user;
              local_1570._4_4_ = uVar66;
              local_1570._0_4_ = uVar66;
              local_1570._8_4_ = uVar66;
              local_1570._12_4_ = uVar66;
              local_1580 = *(undefined4 *)((long)&local_1400 + uVar64);
              local_15d0 = *(undefined4 *)((long)local_1280 + uVar64);
              uVar1 = *(undefined4 *)(local_1260 + uVar64);
              local_15c0._4_4_ = uVar1;
              local_15c0._0_4_ = uVar1;
              local_15c0._8_4_ = uVar1;
              local_15c0._12_4_ = uVar1;
              local_15b0 = *(undefined4 *)((long)local_1240 + uVar64);
              vpcmpeqd_avx2(ZEXT1632(local_1570),ZEXT1632(local_1570));
              uStack_155c = (local_17f0.context)->instID[0];
              local_1560 = uStack_155c;
              uStack_1558 = uStack_155c;
              uStack_1554 = uStack_155c;
              uStack_1550 = (local_17f0.context)->instPrimID[0];
              uStack_154c = uStack_1550;
              uStack_1548 = uStack_1550;
              uStack_1544 = uStack_1550;
              local_1820 = *local_1800;
              local_17f0.valid = (int *)local_1820;
              local_17f0.geometryUserPtr = pGVar9->userPtr;
              local_17f0.hit = (RTCHitN *)&local_15d0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_15cc = local_15d0;
              uStack_15c8 = local_15d0;
              uStack_15c4 = local_15d0;
              uStack_15ac = local_15b0;
              uStack_15a8 = local_15b0;
              uStack_15a4 = local_15b0;
              uStack_159c = local_15a0;
              uStack_1598 = local_15a0;
              uStack_1594 = local_15a0;
              uStack_157c = local_1580;
              uStack_1578 = local_1580;
              uStack_1574 = local_1580;
              if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->occlusionFilterN)(&local_17f0);
                auVar119 = ZEXT3264(local_1700);
                auVar114 = ZEXT3264(local_16e0);
                auVar112 = ZEXT3264(local_16c0);
                fVar122 = local_1720;
                fVar125 = fStack_171c;
                fVar128 = fStack_1718;
                fVar129 = fStack_1714;
                fVar130 = fStack_1710;
                fVar131 = fStack_170c;
                fVar132 = fStack_1708;
                fVar133 = fStack_1704;
                fVar123 = local_1740;
                fVar136 = fStack_173c;
                fVar137 = fStack_1738;
                fVar138 = fStack_1734;
                fVar139 = fStack_1730;
                fVar140 = fStack_172c;
                fVar141 = fStack_1728;
                fVar142 = fStack_1724;
                fVar124 = local_1760;
                fVar143 = fStack_175c;
                fVar144 = fStack_1758;
                fVar145 = fStack_1754;
                fVar146 = fStack_1750;
                fVar147 = fStack_174c;
                fVar148 = fStack_1748;
                fVar149 = fStack_1744;
                fVar115 = local_1780;
                fVar151 = fStack_177c;
                fVar152 = fStack_1778;
                fVar153 = fStack_1774;
                fVar154 = fStack_1770;
                fVar155 = fStack_176c;
                fVar156 = fStack_1768;
                fVar157 = fStack_1764;
                fVar120 = local_17a0;
                fVar159 = fStack_179c;
                fVar160 = fStack_1798;
                fVar161 = fStack_1794;
                fVar162 = fStack_1790;
                fVar163 = fStack_178c;
                fVar164 = fStack_1788;
                fVar165 = fStack_1784;
                fVar121 = local_17c0;
                fVar167 = fStack_17bc;
                fVar168 = fStack_17b8;
                fVar169 = fStack_17b4;
                fVar170 = fStack_17b0;
                fVar171 = fStack_17ac;
                fVar172 = fStack_17a8;
                fVar173 = fStack_17a4;
              }
              if (local_1820 == (undefined1  [16])0x0) {
                auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar37 = auVar37 ^ _DAT_01f7ae20;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var10)(&local_17f0);
                  auVar119 = ZEXT3264(local_1700);
                  auVar114 = ZEXT3264(local_16e0);
                  auVar112 = ZEXT3264(local_16c0);
                  fVar122 = local_1720;
                  fVar125 = fStack_171c;
                  fVar128 = fStack_1718;
                  fVar129 = fStack_1714;
                  fVar130 = fStack_1710;
                  fVar131 = fStack_170c;
                  fVar132 = fStack_1708;
                  fVar133 = fStack_1704;
                  fVar123 = local_1740;
                  fVar136 = fStack_173c;
                  fVar137 = fStack_1738;
                  fVar138 = fStack_1734;
                  fVar139 = fStack_1730;
                  fVar140 = fStack_172c;
                  fVar141 = fStack_1728;
                  fVar142 = fStack_1724;
                  fVar124 = local_1760;
                  fVar143 = fStack_175c;
                  fVar144 = fStack_1758;
                  fVar145 = fStack_1754;
                  fVar146 = fStack_1750;
                  fVar147 = fStack_174c;
                  fVar148 = fStack_1748;
                  fVar149 = fStack_1744;
                  fVar115 = local_1780;
                  fVar151 = fStack_177c;
                  fVar152 = fStack_1778;
                  fVar153 = fStack_1774;
                  fVar154 = fStack_1770;
                  fVar155 = fStack_176c;
                  fVar156 = fStack_1768;
                  fVar157 = fStack_1764;
                  fVar120 = local_17a0;
                  fVar159 = fStack_179c;
                  fVar160 = fStack_1798;
                  fVar161 = fStack_1794;
                  fVar162 = fStack_1790;
                  fVar163 = fStack_178c;
                  fVar164 = fStack_1788;
                  fVar165 = fStack_1784;
                  fVar121 = local_17c0;
                  fVar167 = fStack_17bc;
                  fVar168 = fStack_17b8;
                  fVar169 = fStack_17b4;
                  fVar170 = fStack_17b0;
                  fVar171 = fStack_17ac;
                  fVar172 = fStack_17a8;
                  fVar173 = fStack_17a4;
                }
                auVar79 = vpcmpeqd_avx(local_1820,_DAT_01f7aa10);
                auVar37 = auVar79 ^ _DAT_01f7ae20;
                auVar85._8_4_ = 0xff800000;
                auVar85._0_8_ = 0xff800000ff800000;
                auVar85._12_4_ = 0xff800000;
                auVar79 = vblendvps_avx(auVar85,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar79);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar79;
              }
              auVar94 = ZEXT3264(local_1660);
              auVar99 = ZEXT3264(local_1680);
              auVar110 = ZEXT3264(local_16a0);
              auVar79._8_8_ = 0x100000001;
              auVar79._0_8_ = 0x100000001;
              if ((auVar79 & auVar37) != (undefined1  [16])0x0) goto LAB_005e9f02;
              *(int *)(ray + k * 4 + 0x80) = local_1600._0_4_;
              uVar64 = local_1640._0_8_ ^ 1L << (local_1620._0_8_ & 0x3f);
            }
          } while (uVar64 != 0);
        }
        local_1808 = local_1808 + 1;
      } while (local_1808 != local_1810);
    }
LAB_005e9eec:
    bVar75 = puVar70 != &local_1200;
    if (!bVar75) {
      return bVar75;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }